

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

void lua_pushstring(lua_State *L,char *str)

{
  uint64_t uVar1;
  TValue *pTVar2;
  size_t lenx;
  GCstr *pGVar3;
  
  if (str == (char *)0x0) {
    L->top->u64 = 0xffffffffffffffff;
  }
  else {
    uVar1 = (L->glref).ptr64;
    if (*(ulong *)(uVar1 + 0x18) <= *(ulong *)(uVar1 + 0x10)) {
      lj_gc_step(L);
    }
    lenx = strlen(str);
    pGVar3 = lj_str_new(L,str,lenx);
    L->top->u64 = (ulong)pGVar3 | 0xfffd800000000000;
  }
  pTVar2 = L->top;
  L->top = pTVar2 + 1;
  if (pTVar2 + 1 < (TValue *)(L->maxstack).ptr64) {
    return;
  }
  lj_state_growstack1(L);
  return;
}

Assistant:

LUA_API void lua_pushstring(lua_State *L, const char *str)
{
  if (str == NULL) {
    setnilV(L->top);
  } else {
    GCstr *s;
    lj_gc_check(L);
    s = lj_str_newz(L, str);
    setstrV(L, L->top, s);
  }
  incr_top(L);
}